

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall MemoryBufferTest_MoveCtor_Test::TestBody(MemoryBufferTest_MoveCtor_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *file;
  Message *message;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *in_stack_00000028;
  char *in_stack_00000030;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> buffer2;
  char *inline_buffer_ptr;
  char test [5];
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> buffer;
  allocator<char> alloc;
  allocator_ref<std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  char *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int line;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  Type TVar3;
  allocator *paVar2;
  basic_buffer<char> *in_stack_fffffffffffffe90;
  Message *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [8];
  uint *in_stack_ffffffffffffff10;
  unsigned_long *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  AssertionResult local_b0;
  basic_buffer<char> local_a0;
  undefined1 local_69;
  char *local_68;
  undefined1 local_5d;
  undefined4 local_5c;
  undefined1 local_58;
  allocator_ref<std::allocator<char>_> local_48;
  basic_buffer<char> local_40;
  allocator<char> local_9 [9];
  
  std::allocator<char>::allocator();
  allocator_ref<std::allocator<char>_>::allocator_ref(&local_48,local_9);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  basic_memory_buffer(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_58 = 0;
  local_5c = 0x74736574;
  fmt::v5::internal::basic_buffer<char>::append<char>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
  TVar3 = (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  check_move_buffer(in_stack_00000030,in_stack_00000028);
  local_5d = 0x61;
  fmt::v5::internal::basic_buffer<char>::push_back
            (&in_stack_fffffffffffffe60->super_basic_buffer<char>,(char *)in_stack_fffffffffffffe58)
  ;
  check_move_buffer(in_stack_00000030,in_stack_00000028);
  local_68 = fmt::v5::internal::basic_buffer<char>::operator[](&local_40,0);
  local_69 = 0x62;
  fmt::v5::internal::basic_buffer<char>::push_back
            (&in_stack_fffffffffffffe60->super_basic_buffer<char>,(char *)in_stack_fffffffffffffe58)
  ;
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  basic_memory_buffer(in_stack_fffffffffffffe80,
                      (basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *)
                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  fmt::v5::internal::basic_buffer<char>::operator[](&local_40,0);
  testing::internal::EqHelper<false>::Compare<char_const*,char*>
            ((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe70,
             (char **)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (char **)in_stack_fffffffffffffe60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90);
    testing::AssertionResult::failure_message((AssertionResult *)0x123f78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe90,TVar3,(char *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x123fd5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12402d);
  this_00 = (AssertHelper *)fmt::v5::internal::basic_buffer<char>::operator[](&local_a0,0);
  file = (char *)fmt::v5::internal::basic_buffer<char>::size(&local_a0);
  paVar2 = &local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,(char *)this_00,(ulong)file,paVar2);
  TVar3 = (Type)((ulong)paVar2 >> 0x20);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe70,
             (char (*) [7])CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff28);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe7c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe70 =
         testing::AssertionResult::failure_message((AssertionResult *)0x12417f);
    testing::internal::AssertHelper::AssertHelper(this_00,TVar3,file,line,in_stack_fffffffffffffe70)
    ;
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x1241dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x124231);
  message = (Message *)fmt::v5::internal::basic_buffer<char>::capacity(&local_a0);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffee0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe60 =
         (basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1242de);
    testing::internal::AssertHelper::AssertHelper(this_00,TVar3,file,line,in_stack_fffffffffffffe70)
    ;
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffee0,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x12432c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12437b);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  ~basic_memory_buffer(in_stack_fffffffffffffe60);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  ~basic_memory_buffer(in_stack_fffffffffffffe60);
  std::allocator<char>::~allocator(local_9);
  return;
}

Assistant:

TEST(MemoryBufferTest, MoveCtor) {
  std::allocator<char> alloc;
  basic_memory_buffer<char, 5, TestAllocator> buffer((TestAllocator(&alloc)));
  const char test[] = "test";
  buffer.append(test, test + 4);
  check_move_buffer("test", buffer);
  // Adding one more character fills the inline buffer, but doesn't cause
  // dynamic allocation.
  buffer.push_back('a');
  check_move_buffer("testa", buffer);
  const char *inline_buffer_ptr = &buffer[0];
  // Adding one more character causes the content to move from the inline to
  // a dynamically allocated buffer.
  buffer.push_back('b');
  basic_memory_buffer<char, 5, TestAllocator> buffer2(std::move(buffer));
  // Move should rip the guts of the first buffer.
  EXPECT_EQ(inline_buffer_ptr, &buffer[0]);
  EXPECT_EQ("testab", std::string(&buffer2[0], buffer2.size()));
  EXPECT_GT(buffer2.capacity(), 5u);
}